

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O2

void __thiscall libchess::Position::generate_castling(Position *this,MoveList *move_list,Color c)

{
  Square square;
  Bitboard BVar1;
  Color c_00;
  Color c_01;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  uVar2 = this->color_bb_[1].value_ | this->color_bb_[0].value_;
  lVar4 = (long)(int)c.super_MetaValueType<int>.value_;
  if (((*(uint *)(&DAT_00113ef0 + lVar4 * 8) &
       (this->history_).
       super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
       _M_impl.super__Vector_impl_data._M_start[this->ply_].castling_rights_.value_) != 0) &&
     (lVar3 = lVar4 * 0x10, (*(ulong *)(&DAT_00115b40 + lVar3) & uVar2) == 0)) {
    square.super_MetaValueType<int>.value_ =
         (MetaValueType<int>)((MetaValueType<int> *)(&DAT_00115b20 + lVar3))->value_;
    c_00.super_MetaValueType<int>.value_._1_3_ = 0;
    c_00.super_MetaValueType<int>.value_._0_1_ = c.super_MetaValueType<int>.value_ == 0;
    BVar1 = attackers_to(this,square,c_00);
    if (BVar1.value_ == 0) {
      BVar1 = attackers_to(this,(Square)((MetaValueType<int> *)(&DAT_00115b00 + lVar3))->value_,c_00
                          );
      if (BVar1.value_ == 0) {
        BVar1 = attackers_to(this,(Square)((MetaValueType<int> *)(&DAT_00115b04 + lVar3))->value_,
                             c_00);
        if (BVar1.value_ == 0) {
          MoveList::add(move_list,
                        (Move)((uint)square.super_MetaValueType<int>.value_ |
                               *(int *)(&DAT_00115b24 + lVar3) << 6 | 0x10000));
        }
      }
    }
  }
  if (((*(uint *)(&DAT_00113ef4 + lVar4 * 8) &
       (this->history_).
       super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
       _M_impl.super__Vector_impl_data._M_start[this->ply_].castling_rights_.value_) != 0) &&
     (lVar4 = lVar4 * 0x10, (*(ulong *)(&DAT_00115b48 + lVar4) & uVar2) == 0)) {
    c_01.super_MetaValueType<int>.value_._1_3_ = 0;
    c_01.super_MetaValueType<int>.value_._0_1_ = c.super_MetaValueType<int>.value_ == 0;
    BVar1 = attackers_to(this,(Square)((MetaValueType<int> *)(&DAT_00115b20 + lVar4))->value_,c_01);
    if (BVar1.value_ == 0) {
      BVar1 = attackers_to(this,(Square)((MetaValueType<int> *)(&DAT_00115b08 + lVar4))->value_,c_01
                          );
      if (BVar1.value_ == 0) {
        BVar1 = attackers_to(this,(Square)((MetaValueType<int> *)(&DAT_00115b0c + lVar4))->value_,
                             c_01);
        if (BVar1.value_ == 0) {
          MoveList::add(move_list,
                        (Move)(*(int *)(&DAT_00115b2c + lVar4) << 6 |
                               *(uint *)(&DAT_00115b28 + lVar4) | 0x10000));
          return;
        }
      }
    }
  }
  return;
}

Assistant:

inline void Position::generate_castling(MoveList& move_list, Color c) const {
    const int castling_possibilities[2][2] = {
        {constants::WHITE_KINGSIDE.value(), constants::WHITE_QUEENSIDE.value()},
        {constants::BLACK_KINGSIDE.value(), constants::BLACK_QUEENSIDE.value()},
    };
    const Square castling_intermediate_sqs[2][2][2] = {
        {{constants::F1, constants::G1}, {constants::D1, constants::C1}},
        {{constants::F8, constants::G8}, {constants::D8, constants::C8}}};
    const Square castling_king_sqs[2][2][2] = {
        {{constants::E1, constants::G1}, {constants::E1, constants::C1}},
        {{constants::E8, constants::G8}, {constants::E8, constants::C8}}};
    const Bitboard castle_mask[2][2] = {
        {(Bitboard{constants::F1} | Bitboard{constants::G1}),
         (Bitboard{constants::D1} | Bitboard{constants::C1} | Bitboard{constants::B1})},
        {(Bitboard{constants::F8} | Bitboard{constants::G8}),
         (Bitboard{constants::D8} | Bitboard{constants::C8} | Bitboard{constants::B8})}};

    Bitboard occupancy = occupancy_bb();
    if ((castling_possibilities[c][0] & castling_rights().value()) &&
        !(castle_mask[c][0] & occupancy) && !(attackers_to(castling_king_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][0][1], !c))) {
        move_list.add(
            Move{castling_king_sqs[c][0][0], castling_king_sqs[c][0][1], Move::Type::CASTLING});
    }
    if ((castling_possibilities[c][1] & castling_rights().value()) &&
        !(castle_mask[c][1] & occupancy) && !(attackers_to(castling_king_sqs[c][0][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][1][0], !c)) &&
        !(attackers_to(castling_intermediate_sqs[c][1][1], !c))) {
        move_list.add(
            Move{castling_king_sqs[c][1][0], castling_king_sqs[c][1][1], Move::Type::CASTLING});
    }
}